

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitStringEq(BinaryInstWriter *this,StringEq *curr)

{
  U32LEB x;
  
  BufferWithRandomAccess::operator<<(this->o,-5);
  x.value = 0x89;
  if (curr->op != StringEqEqual) {
    if (curr->op != StringEqCompare) {
      handle_unreachable("invalid string.eq*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0xa32);
    }
    x.value = 0xa8;
  }
  BufferWithRandomAccess::operator<<(this->o,x);
  return;
}

Assistant:

void BinaryInstWriter::visitStringEq(StringEq* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringEqEqual:
      o << U32LEB(BinaryConsts::StringEq);
      break;
    case StringEqCompare:
      o << U32LEB(BinaryConsts::StringCompare);
      break;
    default:
      WASM_UNREACHABLE("invalid string.eq*");
  }
}